

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

bool __thiscall
QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>::separatorMove
          (QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *this,QPoint *pos)

{
  long lVar1;
  QWidget *obj;
  
  lVar1 = (this->movingSeparator).d.size;
  if (lVar1 != 0) {
    this->movingSeparatorPos = *pos;
    obj = QLayout::parentWidget((QLayout *)&this[-1].movingSeparator.d.size);
    QBasicTimer::start(&this->separatorMoveTimer,(Duration)0x0,&obj->super_QObject);
  }
  return lVar1 != 0;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }